

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

void lws_http_close_immortal(lws *wsi)

{
  int iVar1;
  ulong uVar2;
  lws *plVar3;
  lws_log_cx_t *cx;
  uint8_t uVar4;
  lws *wsi_00;
  char *pcVar5;
  int secs;
  
  uVar2 = *(ulong *)&wsi->field_0x46e;
  if ((uVar2 & 2) != 0) {
    if ((uVar2 & 8) == 0) {
      __assert_fail("wsi->mux_stream_immortal",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x4ec,"void lws_http_close_immortal(struct lws *)");
    }
    *(ulong *)&wsi->field_0x46e = uVar2 & 0xfffffffffffffff7;
    plVar3 = wsi;
    do {
      wsi_00 = plVar3;
      plVar3 = (wsi_00->mux).parent_wsi;
    } while (plVar3 != (lws *)0x0);
    cx = (wsi->lc).log_cx;
    pcVar5 = lws_lc_tag(&wsi_00->lc);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_http_close_immortal","%s (%d)",pcVar5,
                (ulong)wsi_00->immortal_substream_count);
    if (wsi_00->immortal_substream_count == '\0') {
      __assert_fail("nwsi->immortal_substream_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x4f2,"void lws_http_close_immortal(struct lws *)");
    }
    uVar4 = wsi_00->immortal_substream_count + 0xff;
    wsi_00->immortal_substream_count = uVar4;
    if (uVar4 == '\0') {
      iVar1 = ((wsi->a).vhost)->keepalive_timeout;
      secs = 0x1f;
      if (iVar1 != 0) {
        secs = iVar1;
      }
      lws_set_timeout(wsi_00,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,secs);
      return;
    }
  }
  return;
}

Assistant:

void
lws_http_close_immortal(struct lws *wsi)
{
	struct lws *nwsi;

	if (!wsi->mux_substream)
		return;

	assert(wsi->mux_stream_immortal);
	wsi->mux_stream_immortal = 0;

	nwsi = lws_get_network_wsi(wsi);
	lwsl_wsi_debug(wsi, "%s (%d)", lws_wsi_tag(nwsi),
				       nwsi->immortal_substream_count);
	assert(nwsi->immortal_substream_count);
	nwsi->immortal_substream_count--;
	if (!nwsi->immortal_substream_count)
		/*
		 * since we closed the only immortal stream on this nwsi, we
		 * need to reapply a normal timeout regime to the nwsi
		 */
		lws_set_timeout(nwsi, PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
				wsi->a.vhost->keepalive_timeout ?
				    wsi->a.vhost->keepalive_timeout : 31);
}